

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O1

bool __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::has_label_value
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *label_value)

{
  pointer pbVar1;
  pointer pbVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  bool bVar7;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> arr;
  undefined1 local_78 [24];
  atomic<long> aStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_48 [4];
  undefined1 *local_28;
  
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78._16_8_ = (pointer)0x0;
  aStack_60.super___atomic_base<long>._M_i = (__atomic_base<long>)0;
  lVar3 = 0x10;
  do {
    *(undefined1 **)(local_78 + lVar3) = local_78 + lVar3 + 0x10;
    *(undefined8 *)(local_78 + lVar3 + 8) = 0;
    local_78[lVar3 + 0x10] = 0;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x50);
  pbVar1 = (label_value->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (label_value->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pbVar2 - (long)pbVar1;
  if (uVar4 < 0x41) {
    if (pbVar2 != pbVar1) {
      lVar5 = (ulong)(uVar4 == 0x40) + 1;
      lVar3 = 0;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_78 + lVar3 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(((label_value->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3)
                  );
        lVar3 = lVar3 + 0x20;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    local_28 = local_78 + 0x10;
    util::
    map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::my_hash<137UL>_>
    ::find((map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::my_hash<137UL>_>
            *)local_78,
           (key_type *)
           &(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).map_);
    bVar7 = (pointer)local_78._0_8_ != (pointer)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  else {
    bVar7 = false;
  }
  lVar3 = -0x40;
  plVar6 = local_48 + 2;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  return bVar7;
}

Assistant:

bool has_label_value(const std::vector<std::string> &label_value) override {
    std::array<std::string, N> arr{};
    size_t size = (std::min)((size_t)N, label_value.size());
    if (label_value.size() > N) {
      return false;
    }

    for (size_t i = 0; i < size; i++) {
      arr[i] = label_value[i];
    }
    return Base::find(arr) != nullptr;
  }